

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void text_getrect(t_gobj *z,_glist *glist,int *xp1,int *yp1,int *xp2,int *yp2)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _rtext *x;
  byte bVar6;
  float fVar7;
  
  bVar6 = *(byte *)((long)&z[2].g_next + 6) & 3;
  if ((glist->gl_editor == (t_editor *)0x0) || (glist->gl_editor->e_rtext == (_rtext *)0x0)) {
    iVar3 = 10;
    if (bVar6 == 3) {
      sVar1 = *(short *)((long)&z[2].g_next + 4);
      iVar2 = 10;
      if (0 < sVar1) {
        iVar2 = glist_fontwidth(glist);
        iVar2 = iVar2 * sVar1;
        iVar3 = glist_fontheight(glist);
        iVar4 = glist_getzoom(glist);
        if (iVar4 < 2) {
          iVar2 = iVar2 + 2;
          iVar3 = iVar3 + 4;
        }
        else {
          iVar4 = glist_getzoom(glist);
          iVar2 = iVar2 + iVar4 * 2;
          iVar4 = glist_getzoom(glist);
          iVar3 = iVar3 + iVar4 * 4;
        }
      }
    }
    else {
      iVar2 = 10;
    }
  }
  else {
    x = glist_findrtext(glist,(t_text *)z);
    iVar2 = rtext_width(x);
    iVar3 = rtext_height(x);
    iVar3 = iVar3 + (uint)(bVar6 != 0) * 2 + -2;
  }
  iVar4 = text_xpix((t_text *)z,glist);
  iVar5 = text_ypix((t_text *)z,glist);
  if (bVar6 == 0) {
    fVar7 = 1.0;
  }
  else {
    fVar7 = 0.0;
  }
  *xp1 = (int)(float)iVar4;
  *yp1 = (int)(fVar7 + (float)iVar5);
  *xp2 = (int)((float)iVar2 + (float)iVar4);
  *yp2 = (int)((float)iVar3 + (float)iVar5);
  return;
}

Assistant:

static void text_getrect(t_gobj *z, t_glist *glist,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_text *x = (t_text *)z;
    int width, height, iscomment = (x->te_type == T_TEXT);
    t_float x1, y1, x2, y2;

    if (glist->gl_editor && glist->gl_editor->e_rtext)
    {
        t_rtext *y = glist_findrtext(glist, x);
        width = rtext_width(y);
        height = rtext_height(y) - (iscomment << 1);
    }
        /* for number boxes, we know width and height a priori, and should
        report them here so that graphs can get swelled to fit. */

    else if (x->te_type == T_ATOM && x->te_width > 0)
    {
        width = (x->te_width > 0 ? x->te_width : 6) * glist_fontwidth(glist);
        height = glist_fontheight(glist);
        if (glist_getzoom(glist) > 1)
        {
            /* zoom margins */
            width += ATOM_RMARGIN * glist_getzoom(glist);
            height += ATOM_BMARGIN * glist_getzoom(glist);
        }
        else
        {
            width += ATOM_RMARGIN;
            height += ATOM_BMARGIN;
        }
    }
        /* if we're invisible we don't know our size so we just lie about
        it.  This is called on invisible boxes to establish order of inlets
        and possibly other reasons.
           To find out if the box is visible we can't just check the "vis"
        flag because we might be within the vis() routine and not have set
        that yet.  So we check directly whether the "rtext" list has been
        built.  LATER reconsider when "vis" flag should be on and off? */

    else width = height = 10;
    x1 = text_xpix(x, glist);
    y1 = text_ypix(x, glist);
    x2 = x1 + width;
    y2 = y1 + height;
    y1 += iscomment;
    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}